

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_157::TranslateToExnref::create(TranslateToExnref *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x538);
  memset(__s,0,0x538);
  __s[1] = (_func_int *)0x0;
  __s[2] = (_func_int *)(__s + 4);
  __s[3] = (_func_int *)0x0;
  *(undefined1 *)(__s + 4) = 0;
  *(undefined1 *)(__s + 10) = 0;
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  __s[0x22] = (_func_int *)0x0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  __s[0x25] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__TranslateToExnref_01096558;
  *(undefined1 *)(__s + 0x48) = 0;
  *(undefined1 *)(__s + 0x70) = 0;
  *(undefined1 *)(__s + 0x98) = 0;
  __s[0x99] = (_func_int *)(__s + 0x9f);
  __s[0x9a] = (_func_int *)0x1;
  __s[0x9b] = (_func_int *)0x0;
  __s[0x9c] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x9d) = 0x3f800000;
  __s[0x9e] = (_func_int *)0x0;
  __s[0x9f] = (_func_int *)0x0;
  __s[0xa0] = (_func_int *)(__s + 0xa6);
  __s[0xa1] = (_func_int *)0x1;
  __s[0xa2] = (_func_int *)0x0;
  __s[0xa3] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0xa4) = 0x3f800000;
  __s[0xa5] = (_func_int *)0x0;
  __s[0xa6] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<TranslateToExnref>();
  }